

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::_q_deactivateAllWindows(QMdiAreaPrivate *this,QMdiSubWindow *aboutToActivate)

{
  bool bVar1;
  QWidget *this_00;
  long in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *unaff_retaddr;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  QMdiArea *q;
  QMdiSubWindow *child;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte in_stack_ffffffffffffff8f;
  QMdiAreaPrivate *this_01;
  QFlagsStorageHelper<QMdiArea::AreaOption,_4> local_44;
  QWidget *local_40;
  QPointer<QMdiSubWindow> *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->ignoreWindowStateChange & 1U) == 0) {
    this_00 = (QWidget *)q_func(in_RDI);
    if (in_RSI == 0) {
      QObject::sender();
      qobject_cast<QMdiSubWindow*>((QObject *)0x60e0c1);
      QPointer<QMdiSubWindow>::operator=
                ((QPointer<QMdiSubWindow> *)in_RDI,
                 (QMdiSubWindow *)
                 CONCAT17(in_stack_ffffffffffffff8f,
                          CONCAT16(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))));
    }
    else {
      QPointer<QMdiSubWindow>::operator=
                ((QPointer<QMdiSubWindow> *)in_RDI,
                 (QMdiSubWindow *)
                 CONCAT17(in_stack_ffffffffffffff8f,
                          CONCAT16(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))));
    }
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPointer<QMdiSubWindow>_>::QList
              ((QList<QPointer<QMdiSubWindow>_> *)in_RDI,
               (QList<QPointer<QMdiSubWindow>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,
                        CONCAT16(in_stack_ffffffffffffff8e,
                                 CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))));
    this_01 = (QMdiAreaPrivate *)&local_20;
    local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QPointer<QMdiSubWindow>_>::begin((QList<QPointer<QMdiSubWindow>_> *)in_RDI);
    local_30.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QPointer<QMdiSubWindow>_>::end((QList<QPointer<QMdiSubWindow>_> *)in_RDI);
    while( true ) {
      local_38 = local_30.i;
      bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,local_30);
      if (!bVar1) break;
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
      local_40 = &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60e1aa)->
                  super_QWidget;
      bVar1 = sanityCheck((QMdiSubWindow *)in_RDI,
                          (char *)CONCAT17(in_stack_ffffffffffffff8f,
                                           CONCAT16(in_stack_ffffffffffffff8e,
                                                    CONCAT24(in_stack_ffffffffffffff8c,
                                                             in_stack_ffffffffffffff88))));
      if ((bVar1) &&
         (bVar1 = ::operator==((QPointer<QMdiSubWindow> *)in_RDI,
                               (QMdiSubWindow **)
                               CONCAT17(in_stack_ffffffffffffff8f,
                                        CONCAT16(in_stack_ffffffffffffff8e,
                                                 CONCAT24(in_stack_ffffffffffffff8c,
                                                          in_stack_ffffffffffffff88)))), !bVar1)) {
        in_RDI->ignoreWindowStateChange = true;
        local_44.super_QFlagsStorage<QMdiArea::AreaOption>.i =
             (QFlagsStorage<QMdiArea::AreaOption>)
             QFlags<QMdiArea::AreaOption>::operator&
                       ((QFlags<QMdiArea::AreaOption> *)in_RDI,
                        CONCAT13(in_stack_ffffffffffffff8f,
                                 CONCAT12(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c)));
        bVar1 = QFlags<QMdiArea::AreaOption>::operator!((QFlags<QMdiArea::AreaOption> *)&local_44);
        in_stack_ffffffffffffff8f = 0;
        if (bVar1) {
          in_stack_ffffffffffffff8f = in_RDI->showActiveWindowMaximized ^ 0xff;
        }
        if ((in_stack_ffffffffffffff8f & 1) != 0) {
          bVar1 = QWidget::isMaximized(local_40);
          in_stack_ffffffffffffff8e = false;
          if (bVar1) {
            in_stack_ffffffffffffff8e = QWidget::isVisible((QWidget *)0x60e25f);
          }
          in_RDI->showActiveWindowMaximized = (bool)in_stack_ffffffffffffff8e;
        }
        if (((in_RDI->showActiveWindowMaximized & 1U) != 0) &&
           (bVar1 = QWidget::isMaximized(local_40), bVar1)) {
          bVar1 = QWidget::updatesEnabled((QWidget *)0x60e29d);
          if (bVar1) {
            in_RDI->updatesDisabledByUs = true;
            QWidget::setUpdatesEnabled(this_00,SUB81((ulong)this_01 >> 0x38,0));
          }
          QWidget::showNormal((QWidget *)this_01);
        }
        bVar1 = QWidget::isMinimized(local_40);
        if (((bVar1) && (bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x60e2df), !bVar1)) &&
           (bVar1 = windowStaysOnTop(this_01,(QMdiSubWindow *)in_RDI), !bVar1)) {
          QWidget::lower(this_00);
        }
        in_RDI->ignoreWindowStateChange = false;
        QMdiSubWindow::d_func((QMdiSubWindow *)0x60e316);
        QMdiSubWindowPrivate::setActive
                  (unaff_retaddr,SUB81((ulong)lVar2 >> 0x38,0),SUB81((ulong)lVar2 >> 0x30,0));
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
    }
    QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x60e33e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_deactivateAllWindows(QMdiSubWindow *aboutToActivate)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    if (!aboutToActivate)
        aboutToBecomeActive = qobject_cast<QMdiSubWindow *>(q->sender());
    else
        aboutToBecomeActive = aboutToActivate;
    Q_ASSERT(aboutToBecomeActive);

    // Take a copy because child->showNormal() could indirectly call
    // QCoreApplication::sendEvent(), which could call unknown code that e.g.
    // recurses into the class modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::deactivateAllWindows") || aboutToBecomeActive == child)
            continue;
        // We don't want to handle signals caused by child->showNormal().
        ignoreWindowStateChange = true;
        if (!(options & QMdiArea::DontMaximizeSubWindowOnActivation) && !showActiveWindowMaximized)
            showActiveWindowMaximized = child->isMaximized() && child->isVisible();
        if (showActiveWindowMaximized && child->isMaximized()) {
            if (q->updatesEnabled()) {
                updatesDisabledByUs = true;
                q->setUpdatesEnabled(false);
            }
            child->showNormal();
        }
        if (child->isMinimized() && !child->isShaded() && !windowStaysOnTop(child))
            child->lower();
        ignoreWindowStateChange = false;
        child->d_func()->setActive(false);
    }
}